

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

void __thiscall soplex::SPxException::~SPxException(SPxException *this)

{
  ~SPxException(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~SPxException() {}